

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O1

void __thiscall backend::codegen::RegAllocator::alloc_regs(RegAllocator *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  int iVar4;
  element_type *peVar5;
  Function *pFVar6;
  pointer puVar7;
  iterator __position;
  long lVar8;
  long lVar9;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *this_00;
  char cVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  Inst *pIVar14;
  ulong uVar15;
  _Head_base<0UL,_arm::Inst_*,_false> _Var16;
  Severity *in_RSI;
  char *pcVar17;
  Severity *log_severity;
  RegAllocator *pRVar18;
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar19;
  uint r;
  ostream local_129;
  _Head_base<0UL,_arm::Inst_*,_false> local_128;
  RegAllocator *local_120;
  _Head_base<0UL,_arm::Inst_*,_false> local_118;
  size_type local_110;
  Inst local_108;
  anon_class_8_1_a78179b7_conflict8 local_f8;
  size_type local_f0;
  Inst local_e8;
  undefined **local_d8;
  _Variadic_union<arm::RegisterOperand,_int> local_d0;
  __index_type local_c0 [16];
  undefined1 local_b0;
  ulong local_a8;
  undefined1 local_a0 [8];
  undefined1 local_98 [17];
  undefined7 uStack_87;
  undefined4 uStack_80;
  undefined1 uStack_7c;
  undefined3 uStack_7b;
  _Alloc_hider local_78;
  size_type local_70;
  Inst local_68;
  size_t local_58;
  bool local_50;
  undefined **local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  construct_reg_map(this);
  calc_live_intervals(this);
  local_129 = (ostream)0x0;
  AixLog::operator<<(&local_129,in_RSI);
  local_d8 = &PTR__Tag_001edee0;
  local_d0._M_first._M_storage.super_Displayable._vptr_Displayable = (Displayable)local_c0;
  pcVar17 = "bb_reg_use";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"bb_reg_use","");
  local_b0 = 0;
  AixLog::operator<<((ostream *)&local_d8,(Tag *)pcVar17);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = &PTR__Timestamp_001edeb0;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)pcVar17);
  local_120 = this;
  local_f8.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"alloc_regs","");
  pcVar17 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_118._M_head_impl = &local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,"");
  local_98._0_8_ = local_98 + 0x10;
  local_a0 = (undefined1  [8])&PTR__Function_001edf10;
  if ((Inst *)local_f8.__lhs == &local_e8) {
    uStack_80 = local_e8.op;
    uStack_7c = local_e8.cond;
    uStack_7b = local_e8._13_3_;
  }
  else {
    local_98._0_8_ = local_f8.__lhs;
  }
  uStack_87 = local_e8.super_Displayable._vptr_Displayable._1_7_;
  local_98[0x10] = local_e8.super_Displayable._vptr_Displayable._0_1_;
  local_78._M_p = (pointer)&local_68;
  local_98._8_8_ = local_f0;
  local_f0 = 0;
  local_e8.super_Displayable._vptr_Displayable._0_1_ = 0;
  if (local_118._M_head_impl == &local_108) {
    local_68.op = local_108.op;
    local_68.cond = local_108.cond;
    local_68._13_3_ = local_108._13_3_;
  }
  else {
    local_78._M_p = (pointer)local_118._M_head_impl;
  }
  local_68.super_Displayable._vptr_Displayable._1_7_ =
       local_108.super_Displayable._vptr_Displayable._1_7_;
  local_68.super_Displayable._vptr_Displayable._0_1_ =
       local_108.super_Displayable._vptr_Displayable._0_1_;
  local_70 = local_110;
  local_110 = 0;
  local_108.super_Displayable._vptr_Displayable._0_1_ = 0;
  local_58 = 0x11c;
  local_50 = false;
  local_118._M_head_impl = &local_108;
  local_f8.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)&local_e8;
  AixLog::operator<<((ostream *)local_a0,(Function *)pcVar17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"BB starting point",0x11)
  ;
  cVar10 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  log_severity = (Severity *)(ulong)(uint)(int)cVar10;
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_a0);
  if (local_118._M_head_impl != &local_108) {
    log_severity = (Severity *)
                   (CONCAT71(local_108.super_Displayable._vptr_Displayable._1_7_,
                             local_108.super_Displayable._vptr_Displayable._0_1_) + 1);
    operator_delete(local_118._M_head_impl,(ulong)log_severity);
  }
  if ((Inst *)local_f8.__lhs != &local_e8) {
    log_severity = (Severity *)
                   (CONCAT71(local_e8.super_Displayable._vptr_Displayable._1_7_,
                             local_e8.super_Displayable._vptr_Displayable._0_1_) + 1);
    operator_delete(local_f8.__lhs,(ulong)log_severity);
  }
  local_d8 = &PTR__Tag_001edee0;
  if (local_d0._M_first._M_storage.super_Displayable._vptr_Displayable != (Displayable)local_c0) {
    log_severity = (Severity *)(CONCAT71(local_c0._1_7_,local_c0[0]) + 1);
    operator_delete((void *)local_d0._M_first._M_storage.super_Displayable._vptr_Displayable,
                    (ulong)log_severity);
  }
  p_Var12 = (local_120->point_bb_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128._M_head_impl = (Inst *)&(local_120->point_bb_map)._M_t._M_impl.super__Rb_tree_header;
  if (p_Var12 != (_Base_ptr)local_128._M_head_impl) {
    do {
      _Var3 = p_Var12[1]._M_color;
      local_129 = (ostream)0x0;
      AixLog::operator<<(&local_129,log_severity);
      local_d8 = &PTR__Tag_001edee0;
      local_d0._M_first._M_storage.super_Displayable._vptr_Displayable = (Displayable)local_c0;
      pcVar17 = "bb_reg_use";
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"bb_reg_use","");
      local_b0 = 0;
      AixLog::operator<<((ostream *)&local_d8,(Tag *)pcVar17);
      local_40 = std::chrono::_V2::system_clock::now();
      local_48 = &PTR__Timestamp_001edeb0;
      local_38 = 0;
      AixLog::operator<<((ostream *)&local_48,(Timestamp *)pcVar17);
      local_f8.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)&local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"alloc_regs","");
      pcVar17 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
      ;
      local_118._M_head_impl = &local_108;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                 ,"");
      local_a0 = (undefined1  [8])&PTR__Function_001edf10;
      local_98._0_8_ = local_98 + 0x10;
      if ((Inst *)local_f8.__lhs == &local_e8) {
        uStack_80 = local_e8.op;
        uStack_7c = local_e8.cond;
        uStack_7b = local_e8._13_3_;
      }
      else {
        local_98._0_8_ = local_f8.__lhs;
      }
      uStack_87 = local_e8.super_Displayable._vptr_Displayable._1_7_;
      local_98[0x10] = local_e8.super_Displayable._vptr_Displayable._0_1_;
      local_98._8_8_ = local_f0;
      local_f0 = 0;
      local_e8.super_Displayable._vptr_Displayable._0_1_ = 0;
      local_78._M_p = (pointer)&local_68;
      if (local_118._M_head_impl == &local_108) {
        local_68.op = local_108.op;
        local_68.cond = local_108.cond;
        local_68._13_3_ = local_108._13_3_;
      }
      else {
        local_78._M_p = (pointer)local_118._M_head_impl;
      }
      local_68.super_Displayable._vptr_Displayable._1_7_ =
           local_108.super_Displayable._vptr_Displayable._1_7_;
      local_68.super_Displayable._vptr_Displayable._0_1_ =
           local_108.super_Displayable._vptr_Displayable._0_1_;
      local_70 = local_110;
      local_110 = 0;
      local_108.super_Displayable._vptr_Displayable._0_1_ = 0;
      local_58 = 0x11e;
      local_50 = false;
      local_118._M_head_impl = &local_108;
      local_f8.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)&local_e8;
      AixLog::operator<<((ostream *)local_a0,(Function *)pcVar17);
      poVar11 = (ostream *)std::ostream::operator<<(&std::clog,_Var3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," -> ",4);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      log_severity = (Severity *)(ulong)(uint)(int)cVar10;
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      AixLog::Function::~Function((Function *)local_a0);
      if (local_118._M_head_impl != &local_108) {
        log_severity = (Severity *)
                       (CONCAT71(local_108.super_Displayable._vptr_Displayable._1_7_,
                                 local_108.super_Displayable._vptr_Displayable._0_1_) + 1);
        operator_delete(local_118._M_head_impl,(ulong)log_severity);
      }
      if ((Inst *)local_f8.__lhs != &local_e8) {
        log_severity = (Severity *)
                       (CONCAT71(local_e8.super_Displayable._vptr_Displayable._1_7_,
                                 local_e8.super_Displayable._vptr_Displayable._0_1_) + 1);
        operator_delete(local_f8.__lhs,(ulong)log_severity);
      }
      local_d8 = &PTR__Tag_001edee0;
      if (local_d0._M_first._M_storage.super_Displayable._vptr_Displayable != (Displayable)local_c0)
      {
        log_severity = (Severity *)(CONCAT71(local_c0._1_7_,local_c0[0]) + 1);
        operator_delete((void *)local_d0._M_first._M_storage.super_Displayable._vptr_Displayable,
                        (ulong)log_severity);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != (_Base_ptr)local_128._M_head_impl);
  }
  pRVar18 = local_120;
  calc_reg_affinity(local_120);
  perform_load_stores(pRVar18);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::_M_move_assign(&pRVar18->f->inst,&pRVar18->inst_sink);
  p_Var13 = (pRVar18->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128._M_head_impl =
       *(Inst **)&(((pRVar18->f->inst).
                    super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                  super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>;
  p_Var1 = &(pRVar18->used_regs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var13 != p_Var1) {
    this_00 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
               *)((long)local_128._M_head_impl + 0x10);
    do {
      local_a0._0_4_ = p_Var13[1]._M_color;
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>(this_00,(uint *)local_a0);
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != p_Var1);
  }
  p_Var13 = (pRVar18->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(pRVar18->used_regs_temp)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var13 != p_Var2) {
    pIVar14 = local_128._M_head_impl + 1;
    do {
      local_a0._0_4_ = p_Var13[1]._M_color;
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)pIVar14,(uint *)local_a0);
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != p_Var2);
  }
  p_Var13 = (pRVar18->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  _Var16._M_head_impl =
       (pRVar18->f->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
       super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
  if ((_Rb_tree_header *)p_Var13 != p_Var1) {
    do {
      local_a0._0_4_ = p_Var13[1]._M_color;
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)(_Var16._M_head_impl + 1),(uint *)local_a0);
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != p_Var1);
  }
  p_Var13 = (local_120->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var13 != p_Var2) {
    do {
      local_a0._0_4_ = p_Var13[1]._M_color;
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)(_Var16._M_head_impl + 1),(uint *)local_a0);
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != p_Var2);
  }
  pRVar18 = local_120;
  peVar5 = (local_120->f->ty).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar15 = (long)(peVar5->params).
                 super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(peVar5->params).
                 super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  p_Var12 = *(_Base_ptr *)&local_128._M_head_impl[3].op;
  if ((uVar15 < 0x41) && (local_120->stack_size == 0)) {
    pIVar14 = local_128._M_head_impl + 1;
    pVar19 = std::
             _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
             ::equal_range((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)pIVar14,&arm::REG_FP);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_erase_aux((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)pIVar14,(_Base_ptr)pVar19.first._M_node,(_Base_ptr)pVar19.second._M_node);
    pVar19 = std::
             _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
             ::equal_range((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)(_Var16._M_head_impl + 1),&arm::REG_FP);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_erase_aux((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)(_Var16._M_head_impl + 1),(_Base_ptr)pVar19.first._M_node,
                   (_Base_ptr)pVar19.second._M_node);
  }
  _Var16._M_head_impl = (Inst *)((long)p_Var12 << 2);
  local_a8 = uVar15;
  if (0x40 < uVar15) {
    pFVar6 = pRVar18->f;
    puVar7 = (pFVar6->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_d0._M_rest = (_Variadic_union<int>)(int)_Var16._M_head_impl;
    local_c0[0] = '\x01';
    local_d8 = &PTR_display_001f0838;
    local_128._M_head_impl = _Var16._M_head_impl;
    pIVar14 = (Inst *)operator_new(0x38);
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)local_98,
               (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)&local_d0);
    local_a0 = (undefined1  [8])&PTR_display_001f0838;
    pIVar14->op = Add;
    pIVar14->cond = Always;
    (pIVar14->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001f0908;
    pIVar14[1].super_Displayable._vptr_Displayable = (_func_int **)0xb0000000b;
    local_f8.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)(pIVar14 + 2);
    *(undefined1 *)&pIVar14[3].super_Displayable._vptr_Displayable = 0xff;
    *(undefined1 *)&pIVar14[3].super_Displayable._vptr_Displayable = local_98[0x10];
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr[(long)(char)local_98[0x10] + 1]._M_data)
              (&local_f8,(variant<arm::RegisterOperand,_int> *)local_98);
    *(undefined ***)&pIVar14[1].op = &PTR_display_001f0838;
    local_118._M_head_impl = pIVar14;
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::_M_insert_rval(&pFVar6->inst,puVar7 + 2,(value_type *)&local_118);
    uVar15 = local_a8;
    pRVar18 = local_120;
    _Var16._M_head_impl = local_128._M_head_impl;
    if (local_118._M_head_impl != (Inst *)0x0) {
      (*((local_118._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
    }
  }
  iVar4 = pRVar18->stack_size;
  if (iVar4 == 0) {
    if (uVar15 < 0x41) {
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::_M_erase(&pRVar18->f->inst,
                 (pRVar18->f->inst).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  else {
    local_128._M_head_impl = (Inst *)&pRVar18->f->inst;
    puVar7 = (pRVar18->f->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (iVar4 < 0x400) {
      local_d0._M_rest = (_Variadic_union<int>)iVar4;
      local_c0[0] = '\x01';
      local_d8 = &PTR_display_001f0838;
      pIVar14 = (Inst *)operator_new(0x38);
      std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
                ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)local_98,
                 (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)&local_d0);
      local_a0 = (undefined1  [8])&PTR_display_001f0838;
      pIVar14->op = Sub;
      pIVar14->cond = Always;
      (pIVar14->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001f0908;
      pIVar14[1].super_Displayable._vptr_Displayable = (_func_int **)0xd0000000d;
      local_f8.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)(pIVar14 + 2);
      *(undefined1 *)&pIVar14[3].super_Displayable._vptr_Displayable = 0xff;
      *(undefined1 *)&pIVar14[3].super_Displayable._vptr_Displayable = local_98[0x10];
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
        ::_S_vtable._M_arr[(long)(char)local_98[0x10] + 1]._M_data)
                (&local_f8,(variant<arm::RegisterOperand,_int> *)local_98);
      *(undefined ***)&pIVar14[1].op = &PTR_display_001f0838;
      local_118._M_head_impl = pIVar14;
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        *)local_128._M_head_impl,puVar7 + 2,(value_type *)&local_118);
      uVar15 = local_a8;
      pRVar18 = local_120;
      if (local_118._M_head_impl != (Inst *)0x0) {
        (*((local_118._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
      }
    }
    else {
      local_d0._M_rest = (_Variadic_union<int>)iVar4;
      local_c0[0] = '\x01';
      local_d8 = &PTR_display_001f0838;
      pIVar14 = (Inst *)operator_new(0x38);
      std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
                ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)local_98,
                 (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)&local_d0);
      local_a0 = (undefined1  [8])&PTR_display_001f0838;
      pIVar14->op = Mov;
      pIVar14->cond = Always;
      (pIVar14->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001f0948;
      *(undefined4 *)&pIVar14[1].super_Displayable._vptr_Displayable = 0xc;
      local_f8.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)(pIVar14 + 2);
      *(undefined1 *)&pIVar14[3].super_Displayable._vptr_Displayable = 0xff;
      *(undefined1 *)&pIVar14[3].super_Displayable._vptr_Displayable = local_98[0x10];
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
        ::_S_vtable._M_arr[(long)(char)local_98[0x10] + 1]._M_data)
                (&local_f8,(variant<arm::RegisterOperand,_int> *)local_98);
      *(undefined ***)&pIVar14[1].op = &PTR_display_001f0838;
      local_118._M_head_impl = pIVar14;
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        *)local_128._M_head_impl,puVar7 + 2,(value_type *)&local_118);
      if (local_118._M_head_impl != (Inst *)0x0) {
        (*((local_118._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
      }
      pFVar6 = local_120->f;
      puVar7 = (pFVar6->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a0 = (undefined1  [8])operator_new(0x38);
      ((Inst *)((long)local_a0 + 0x20))->op = Mul;
      *(undefined2 *)&((Inst *)((long)local_a0 + 0x20))->cond = 1;
      ((Inst *)local_a0)->op = Sub;
      ((Inst *)local_a0)->cond = Always;
      (((Inst *)local_a0)->super_Displayable)._vptr_Displayable =
           (_func_int **)&PTR_display_001f0908;
      (((Inst *)((long)local_a0 + 0x10))->super_Displayable)._vptr_Displayable =
           (_func_int **)0xd0000000d;
      *(undefined1 *)&(((Inst *)((long)local_a0 + 0x30))->super_Displayable)._vptr_Displayable = 0;
      (((Inst *)((long)local_a0 + 0x20))->super_Displayable)._vptr_Displayable =
           (_func_int **)&PTR_display_001f07d8;
      *(undefined ***)&((Inst *)((long)local_a0 + 0x10))->op = &PTR_display_001f0838;
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::_M_insert_rval(&pFVar6->inst,puVar7 + 3,(value_type *)local_a0);
      uVar15 = local_a8;
      pRVar18 = local_120;
      if (local_a0 != (undefined1  [8])0x0) {
        (*((Displayable *)local_a0)->_vptr_Displayable[2])();
        pRVar18 = local_120;
      }
    }
  }
  if (pRVar18->stack_size == 0) {
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::_M_erase(&pRVar18->f->inst,
               (pRVar18->f->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -2);
  }
  if (0x40 < uVar15) {
    pFVar6 = pRVar18->f;
    puVar7 = (pFVar6->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_d0._M_rest = (_Variadic_union<int>)(int)_Var16._M_head_impl;
    local_c0[0] = '\x01';
    local_d8 = &PTR_display_001f0838;
    pIVar14 = (Inst *)operator_new(0x38);
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)local_98,
               (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)&local_d0);
    local_a0 = (undefined1  [8])&PTR_display_001f0838;
    pIVar14->op = Sub;
    pIVar14->cond = Always;
    (pIVar14->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001f0908;
    pIVar14[1].super_Displayable._vptr_Displayable = (_func_int **)0xb0000000b;
    local_f8.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)(pIVar14 + 2);
    *(undefined1 *)&pIVar14[3].super_Displayable._vptr_Displayable = 0xff;
    *(undefined1 *)&pIVar14[3].super_Displayable._vptr_Displayable = local_98[0x10];
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr[(long)(char)local_98[0x10] + 1]._M_data)
              (&local_f8,(variant<arm::RegisterOperand,_int> *)local_98);
    *(undefined ***)&pIVar14[1].op = &PTR_display_001f0838;
    local_118._M_head_impl = pIVar14;
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::_M_insert_rval(&pFVar6->inst,puVar7 + -2,(value_type *)&local_118);
    pRVar18 = local_120;
    if (local_118._M_head_impl != (Inst *)0x0) {
      (*((local_118._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
    }
  }
  pFVar6 = pRVar18->f;
  __position._M_current =
       (pFVar6->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pIVar14 = ((__position._M_current)->_M_t).
            super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
  _Var16._M_head_impl =
       (pFVar6->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
       super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
  lVar8._0_4_ = pIVar14[3].op;
  lVar8._4_1_ = pIVar14[3].cond;
  lVar8._5_3_ = *(undefined3 *)&pIVar14[3].field_0xd;
  if (lVar8 == 0) {
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::_M_erase(&pFVar6->inst,__position);
  }
  lVar9._0_4_ = _Var16._M_head_impl[3].op;
  lVar9._4_1_ = _Var16._M_head_impl[3].cond;
  lVar9._5_3_ = *(undefined3 *)&_Var16._M_head_impl[3].field_0xd;
  if (lVar9 == 0) {
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::_M_erase(&pRVar18->f->inst,
               (pRVar18->f->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
  }
  return;
}

Assistant:

void RegAllocator::alloc_regs() {
  construct_reg_map();
  calc_live_intervals();

  LOG(TRACE, "bb_reg_use") << "BB starting point" << std::endl;
  for (auto x : point_bb_map) {
    LOG(TRACE, "bb_reg_use") << x.first << " -> " << x.second << std::endl;
  }

  // LOG(TRACE, "bb_reg_use") << "BB Reg use:" << std::endl;
  // for (auto x : bb_used_regs) {
  //   LOG(TRACE, "bb_reg_use") << x.first << " -> ";
  //   for (auto r : x.second) {
  //     display_reg_name(LOG(TRACE, "color_map"), r);
  //     LOG(TRACE, "bb_reg_use") << " ";
  //   }
  //   LOG(TRACE, "bb_reg_use") << std::endl;
  // }
  calc_reg_affinity();

  perform_load_stores();
  f.inst = std::move(inst_sink);

  {
    // Add used reg stuff
    auto &first = f.inst.front();
    auto first_ = static_cast<PushPopInst *>(&*first);
    for (auto r : used_regs) first_->regs.insert(r);
    for (auto r : used_regs_temp) first_->regs.insert(r);
    auto &last = f.inst.back();
    auto last_ = static_cast<PushPopInst *>(&*last);
    for (auto r : used_regs) last_->regs.insert(r);
    for (auto r : used_regs_temp) last_->regs.insert(r);

    auto use_stack_param = f.ty.get()->params.size() > 4;
    auto offset_size = (first_->regs.size()) * 4;

    if (!use_stack_param && stack_size == 0) {
      first_->regs.erase(REG_FP);
      last_->regs.erase(REG_FP);
    }

    if (use_stack_param) {
      f.inst.insert(f.inst.begin() + 2,
                    std::make_unique<Arith3Inst>(OpCode::Add, REG_FP, REG_FP,
                                                 Operand2(offset_size)));
    }

    if (stack_size == 0) {
      // sp does not change.
      if (!use_stack_param) {
        // no need to use fp
        f.inst.erase(f.inst.begin() + 1);
      }
    } else if (stack_size < 1024) {
      f.inst.insert(f.inst.begin() + 2,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_SP, REG_SP,
                                                 Operand2(stack_size)));
    } else {
      f.inst.insert(
          f.inst.begin() + 2,
          std::make_unique<Arith2Inst>(OpCode::Mov, 12, Operand2(stack_size)));
      f.inst.insert(f.inst.begin() + 3,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_SP, REG_SP,
                                                 RegisterOperand(12)));
    }

    if (stack_size == 0) {
      // sp hasn't change throught function
      f.inst.erase(f.inst.end() - 2);
    }

    if (use_stack_param) {
      f.inst.insert(f.inst.end() - 2,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_FP, REG_FP,
                                                 Operand2(offset_size)));
    }
    {
      auto &first = f.inst.front();
      auto first_ = static_cast<PushPopInst *>(&*first);
      auto &last = f.inst.back();
      auto last_ = static_cast<PushPopInst *>(&*last);
      if (first_->regs.empty()) f.inst.erase(f.inst.begin());
      if (last_->regs.empty()) f.inst.erase(f.inst.end() - 1);
    }
  }
}